

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_log.c
# Opt level: O1

int metacall_log(metacall_log_id log_id,void *ctx)

{
  int iVar1;
  log_policy plVar2;
  log_policy plVar3;
  log_policy plVar4;
  log_policy plVar5;
  metacall_log_stdio stdio_ctx;
  
  switch(log_id) {
  case METACALL_LOG_STDIO:
    plVar2 = log_policy_format_text_flags(1);
    plVar3 = log_policy_schedule_sync();
    plVar4 = log_policy_storage_sequential();
    plVar5 = log_policy_stream_stdio(*ctx);
    break;
  case METACALL_LOG_FILE:
    plVar2 = log_policy_format_text_flags(1);
    plVar3 = log_policy_schedule_sync();
    plVar4 = log_policy_storage_sequential();
    plVar5 = log_policy_stream_file(*ctx,*(char **)((long)ctx + 8));
    break;
  case METACALL_LOG_SOCKET:
    plVar2 = log_policy_format_text_flags(0);
    plVar3 = log_policy_schedule_sync();
    plVar4 = log_policy_storage_sequential();
    plVar5 = log_policy_stream_socket(*ctx,*(uint16_t *)((long)ctx + 8));
    break;
  case METACALL_LOG_SYSLOG:
    plVar2 = log_policy_format_text_flags(1);
    plVar3 = log_policy_schedule_sync();
    plVar4 = log_policy_storage_sequential();
    plVar5 = log_policy_stream_syslog(*ctx);
    break;
  case METACALL_LOG_NGINX:
    plVar2 = log_policy_format_text_flags(0);
    plVar3 = log_policy_schedule_sync();
    plVar4 = log_policy_storage_sequential();
    plVar5 = log_policy_stream_nginx
                       (*ctx,*(_func_void **)((long)ctx + 8),*(uint16_t *)((long)ctx + 0x10));
    break;
  case METACALL_LOG_CUSTOM:
    plVar2 = log_policy_format_custom
                       (*ctx,*(log_policy_format_custom_size_ptr *)((long)ctx + 8),
                        *(log_policy_format_custom_serialize_ptr *)((long)ctx + 0x10),
                        *(log_policy_format_custom_deserialize_ptr *)((long)ctx + 0x18));
    plVar3 = log_policy_schedule_sync();
    plVar4 = log_policy_storage_sequential();
    plVar5 = log_policy_stream_custom
                       (*ctx,*(_func_int_void_ptr_char_ptr_size_t **)((long)ctx + 0x20),
                        *(_func_int_void_ptr **)((long)ctx + 0x28));
    break;
  default:
    return 1;
  }
  iVar1 = log_configure_impl("metacall",4,plVar2,plVar3,plVar4,plVar5);
  return iVar1;
}

Assistant:

int metacall_log(enum metacall_log_id log_id, void *ctx)
{
	switch (log_id)
	{
		case METACALL_LOG_STDIO: {
			metacall_log_stdio stdio_ctx = (metacall_log_stdio)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_stdio(stdio_ctx->stream));
		}

		case METACALL_LOG_FILE: {
			metacall_log_file file_ctx = (metacall_log_file)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_file(file_ctx->file_name, file_ctx->mode));
		}

		case METACALL_LOG_SOCKET: {
			metacall_log_socket socket_ctx = (metacall_log_socket)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_socket(socket_ctx->ip, socket_ctx->port));
		}

		case METACALL_LOG_SYSLOG: {
			metacall_log_syslog syslog_ctx = (metacall_log_syslog)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_syslog(syslog_ctx->name));
		}

		case METACALL_LOG_NGINX: {
			metacall_log_nginx nginx_ctx = (metacall_log_nginx)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_nginx(nginx_ctx->log, nginx_ctx->log_error, nginx_ctx->log_level));
		}

		case METACALL_LOG_CUSTOM: {
			metacall_log_custom custom_ctx = (metacall_log_custom)ctx;

			return log_configure("metacall",
				log_policy_format_custom(custom_ctx->context, (log_policy_format_custom_size_ptr)custom_ctx->format_size, (log_policy_format_custom_serialize_ptr)custom_ctx->format_serialize, (log_policy_format_custom_deserialize_ptr)custom_ctx->format_deserialize),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_custom(custom_ctx->context, custom_ctx->stream_write, custom_ctx->stream_flush));
		}
	}

	return 1;
}